

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O1

void check_all(void)

{
  long lVar1;
  ostream *poVar2;
  runtime_error *this;
  size_t sVar3;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  lVar1 = 0;
  do {
    if ((memory[lVar1] != (void *)0x0) && (sizes[lVar1] != 0)) {
      sVar3 = 0;
      do {
        if (*(char *)((long)memory[lVar1] + sVar3) != vals[lVar1]) {
          std::__cxx11::ostringstream::ostringstream(local_190);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_190,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/allocator_test.cpp"
                     ,0x61);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," s[j]==c",8);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this,local_1b0);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar3 = sVar3 + 1;
      } while (sizes[lVar1] != sVar3);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 100);
  return;
}

Assistant:

void check_all()
{
	for(size_t pos = 0;pos < objects;pos++) {
		if(!memory[pos])
			continue;
		char c=vals[pos];
		size_t size = sizes[pos]; 
		char *s = static_cast<char *>(memory[pos]);
		for(size_t j=0;j<size;j++) {
			TEST(s[j]==c);
		}
	}
}